

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osd_g.c
# Opt level: O3

int osd_g(mod2sparse *A,char *synd,char *osd0_decoding,char *osdw_decoding,double *log_prob_ratios,
         int osd_order,int A_rank)

{
  uint n;
  uint n_00;
  bool bVar1;
  int iVar2;
  mod2sparse *L;
  mod2sparse *U;
  mod2sparse *r;
  int *cols;
  int *cols_00;
  int *rows;
  char *u;
  char *x;
  char *out_vec;
  char *v;
  int *integers;
  int *cols_01;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint n_01;
  unsigned_long j;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int local_b8;
  
  n = A->n_rows;
  n_00 = A->n_cols;
  uVar7 = (ulong)n_00;
  n_01 = n_00 - A_rank;
  L = mod2sparse_allocate(n,A_rank);
  U = mod2sparse_allocate(A_rank,n_00);
  r = mod2sparse_allocate(n,n_01);
  cols = (int *)chk_alloc(n_01,4);
  cols_00 = (int *)chk_alloc(n_00,4);
  rows = (int *)chk_alloc(n,4);
  u = (char *)chk_alloc(n_00,1);
  x = (char *)chk_alloc(n_00,1);
  out_vec = (char *)chk_alloc(n,1);
  v = (char *)chk_alloc(n,1);
  integers = (int *)chk_alloc(n_01,4);
  cols_01 = (int *)chk_alloc(n_01,4);
  osd_0_solve(A,L,U,cols_00,rows,synd,osd0_decoding,log_prob_ratios,A_rank,1);
  uVar8 = (ulong)n_01;
  if (0 < (int)n_01) {
    uVar5 = 0;
    do {
      cols[uVar5] = cols_00[(long)A_rank + uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  mod2sparse_copycols(A,r,cols);
  local_b8 = bin_char_weight(osd0_decoding,n_00);
  if (0 < (int)n_00) {
    uVar5 = 0;
    do {
      osdw_decoding[uVar5] = osd0_decoding[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  if (n_00 != A_rank) {
    lVar3 = 0;
    do {
      u[lVar3] = '\x01';
      mod2sparse_mulvec(r,u,v);
      bin_char_add(synd,v,out_vec,n);
      LU_forward_backward_solve(L,U,rows,cols_00,out_vec,x);
      if (0 < (int)n_01) {
        uVar5 = 0;
        do {
          x[cols[uVar5]] = u[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
      iVar2 = bin_char_weight(x,n_00);
      bVar1 = iVar2 < local_b8;
      if (iVar2 < local_b8) {
        local_b8 = iVar2;
      }
      if (bVar1 && 0 < (int)n_00) {
        uVar5 = 0;
        do {
          osdw_decoding[uVar5] = x[uVar5];
          uVar5 = uVar5 + 1;
          local_b8 = iVar2;
        } while (uVar7 != uVar5);
      }
      integers[lVar3] = iVar2;
      u[lVar3] = '\0';
      lVar3 = lVar3 + 1;
    } while (lVar3 != (int)(n_01 + (n_01 == 0)));
  }
  col_sort_int(integers,cols_01,n_01);
  if (osd_order != 0) {
    uVar5 = 0;
    do {
      uVar6 = 0;
      do {
        if (uVar5 < uVar6) {
          u[cols_01[uVar5]] = '\x01';
          u[cols_01[uVar6]] = '\x01';
          mod2sparse_mulvec(r,u,v);
          bin_char_add(synd,v,out_vec,n);
          LU_forward_backward_solve(L,U,rows,cols_00,out_vec,x);
          if (0 < (int)n_01) {
            uVar4 = 0;
            do {
              x[cols[uVar4]] = u[uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar8 != uVar4);
          }
          iVar2 = bin_char_weight(x,n_00);
          bVar1 = iVar2 < local_b8;
          if (iVar2 < local_b8) {
            local_b8 = iVar2;
          }
          if (bVar1 && 0 < (int)n_00) {
            uVar4 = 0;
            do {
              osdw_decoding[uVar4] = x[uVar4];
              uVar4 = uVar4 + 1;
              local_b8 = iVar2;
            } while (uVar7 != uVar4);
          }
          u[cols_01[uVar5]] = '\0';
          u[cols_01[uVar6]] = '\0';
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (long)osd_order);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (long)osd_order);
  }
  free(integers);
  free(cols_01);
  free(v);
  free(cols);
  free(u);
  free(x);
  free(out_vec);
  mod2sparse_free(r);
  free(rows);
  free(cols_00);
  mod2sparse_free(L);
  mod2sparse_free(U);
  return 0;
}

Assistant:

int osd_g(
        mod2sparse *A,
        char *synd,
        char *osd0_decoding,
        char *osdw_decoding,
        double *log_prob_ratios,
        int osd_order,
        int A_rank){

    int M = mod2sparse_rows(A);
    int N = mod2sparse_cols(A);

    int k= N - A_rank;
    mod2sparse *L=mod2sparse_allocate(M, A_rank);
    mod2sparse *U=mod2sparse_allocate(A_rank, N);
    mod2sparse *Ht=mod2sparse_allocate(M,k);
    int *Ht_cols=chk_alloc(k,sizeof(*Ht_cols));
    int *cols=chk_alloc(N,sizeof(*cols));
    int *rows=chk_alloc(M,sizeof(*rows));

    char *x=chk_alloc(N,sizeof(*x));
    char *y=chk_alloc(N,sizeof(*y));
    char *g=chk_alloc(M,sizeof(*g));
    char *Htx=chk_alloc(M,sizeof(*Htx));

    int *w1_osd_weights=chk_alloc(k,sizeof(*w1_osd_weights));
    int *w1_osd_cols=chk_alloc(k,sizeof(*w1_osd_cols));

//    printf("w: %i",osd_order);

//    exit(22);

    osd_0_solve(
            A,
            L,
            U,
            cols,
            rows,
            synd,
            osd0_decoding,
            log_prob_ratios,
            A_rank,
            1);

    //create the H_T matrix
    for(int col_no=0;col_no<k;col_no++){
        Ht_cols[col_no]=cols[col_no + A_rank];
    }
    mod2sparse_copycols(A,Ht,Ht_cols);


    /*Calculate the weight of the OSD_0 solution. Higher order solutions are compared against this*/
    int osd_0_weight=bin_char_weight(osd0_decoding,N);

    /*Set OSD_0 as the benchmark to beat*/
    int osd_min_weight=osd_0_weight;
    for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=osd0_decoding[bit_no]; //osdw_decoding is set to osd0_decoding initially

    /*Search through the encoding strings*/
    int solution_weight;
    for(long unsigned int j=0; j<k;j++){

        x[j]=1;
        mod2sparse_mulvec(Ht,x,Htx);
        bin_char_add(synd,Htx,g,M);
        LU_forward_backward_solve(L, U, rows, cols, g, y);

        for(int col_no=0;col_no<k;col_no++){
                y[Ht_cols[col_no]]=x[col_no];
            }

        solution_weight=bin_char_weight(y,N);

        if(solution_weight<osd_min_weight){
            osd_min_weight=solution_weight;
            for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=y[bit_no];
        }

        w1_osd_weights[j]=solution_weight;
        x[j]=0;

    }



    col_sort_int(w1_osd_weights,w1_osd_cols,k);

    for(long unsigned int i =0; i<osd_order;i++){
        for(long unsigned int j=0; j<osd_order;j++) {

            if(j<=i) continue;

            x[w1_osd_cols[i]]=1;
            x[w1_osd_cols[j]]=1;

            mod2sparse_mulvec(Ht,x,Htx);
            bin_char_add(synd,Htx,g,M);
            LU_forward_backward_solve(L, U, rows, cols, g, y);

            for(int col_no=0;col_no<k;col_no++){
                y[Ht_cols[col_no]]=x[col_no];
            }


            solution_weight=bin_char_weight(y,N);

            if(solution_weight<osd_min_weight){
                osd_min_weight=solution_weight;
                for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=y[bit_no];
            }

            x[w1_osd_cols[i]]=0;
            x[w1_osd_cols[j]]=0;

        }

    }





    free(w1_osd_weights);
    free(w1_osd_cols);
    free(Htx);
    free(Ht_cols);
    free(x);
    free(y);
    free(g);
    mod2sparse_free(Ht);
    free(rows);
    free(cols);
    mod2sparse_free(L);
    mod2sparse_free(U);

    return 0;

}